

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondStamp.cpp
# Opt level: O0

void __thiscall OpenMD::BondStamp::BondStamp(BondStamp *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  value_type *in_stack_ffffffffffffff08;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *this_00;
  allocator<char> *__a;
  allocator<char> *__s;
  allocator<char> local_91;
  string local_90 [72];
  double local_48;
  allocator<char> local_39;
  string local_38 [56];
  
  DataHolder::DataHolder
            ((DataHolder *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  *(undefined ***)in_RDI = &PTR__BondStamp_0046b8e8;
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  *(undefined1 *)&in_RDI[5]._M_string_length = 0;
  std::__cxx11::string::string((string *)in_RDI[5].field_2._M_local_buf);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x2f6003);
  __a = (allocator<char> *)&in_RDI[3]._M_string_length;
  __s = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,__a);
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  ParameterBase::setOptional((ParameterBase *)&in_RDI[3]._M_string_length,true);
  local_48 = 1.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)&in_RDI[3]._M_string_length,&local_48);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
             *)&in_RDI->_M_string_length;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,__a);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (this_00,&in_stack_ffffffffffffff08->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
            *)this_00,in_stack_ffffffffffffff08);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x2f6143);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  return;
}

Assistant:

BondStamp::BondStamp() : hasOverride_(false) {
    DefineOptionalParameterWithDefaultValue(BondOrder, "bondOrder", 1);
  }